

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManComputeCuts(Jf_Man_t *p,int fEdge)

{
  uint uVar1;
  Jf_Par_t *pJVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pObj;
  long lVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  timespec ts;
  timespec local_48;
  Vec_Set_t *local_38;
  
  if (p->pPars->fVerbose != 0) {
    pGVar6 = p->pGia;
    uVar3 = pGVar6->vCis->nSize;
    uVar1 = pGVar6->vCos->nSize;
    printf("Aig: CI = %d  CO = %d  AND = %d    ",(ulong)uVar3,(ulong)uVar1,
           (ulong)(~(uVar1 + uVar3) + pGVar6->nObjs));
    pJVar2 = p->pPars;
    printf("LutSize = %d  CutMax = %d  Rounds = %d\n",(ulong)(uint)pJVar2->nLutSize,
           (ulong)(uint)pJVar2->nCutNum,(ulong)(uint)pJVar2->nRounds);
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  pGVar6 = p->pGia;
  uVar5 = (ulong)(uint)pGVar6->nObjs;
  if (0 < pGVar6->nObjs) {
    local_38 = &p->pMem;
    lVar9 = 0;
    iVar8 = 0;
    lVar7 = 0;
    do {
      if (pGVar6->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = (Gia_Obj_t *)(&pGVar6->pObjs->field_0x0 + lVar9);
      uVar3 = (uint)*(undefined8 *)pObj;
      if (((uVar3 & 0x9fffffff) == 0x9fffffff) ||
         (((-1 < (int)uVar3 && ((uVar3 & 0x1fffffff) != 0x1fffffff)) &&
          ((uVar3 & 0x1fffffff) == ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))))) {
        if ((int)uVar5 <= lVar7) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        local_48.tv_sec = 0x20100000001;
        uVar3 = (uint)*(undefined8 *)pObj;
        local_48.tv_nsec._0_4_ = iVar8;
        if (((uVar3 & 0x9fffffff) != 0x9fffffff) &&
           ((((int)uVar3 < 0 || ((uVar3 & 0x1fffffff) == 0x1fffffff)) ||
            ((uVar3 & 0x1fffffff) != ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))))) {
          __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                        ,0x451,"void Jf_ObjAssignCut(Jf_Man_t *, Gia_Obj_t *)");
        }
        iVar4 = Vec_SetAppend(local_38,(int *)&local_48,3);
        if ((p->vCuts).nSize <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCuts).pArray[lVar7] = iVar4;
      }
      uVar3 = (uint)*(undefined8 *)pObj;
      if (((-1 < (int)uVar3) && ((uVar3 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar3 & 0x1fffffff) == ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) {
        Gia_ObjId(p->pGia,pObj);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x458,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
        Jf_ObjComputeCuts(p,pObj,fEdge);
      }
      lVar7 = lVar7 + 1;
      pGVar6 = p->pGia;
      uVar5 = (ulong)pGVar6->nObjs;
      iVar8 = iVar8 + 2;
      lVar9 = lVar9 + 0xc;
    } while (lVar7 < (long)uVar5);
  }
  if (p->pPars->fVerbose != 0) {
    printf("CutPair = %lu  ",p->CutCount[0]);
    printf("Merge = %lu  ",p->CutCount[1]);
    printf("Eval = %lu  ",p->CutCount[2]);
    printf("Cut = %lu  ",p->CutCount[3]);
    iVar4 = 3;
    iVar8 = clock_gettime(3,&local_48);
    if (iVar8 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = CONCAT44(local_48.tv_nsec._4_4_,(int)local_48.tv_nsec) / 1000 +
              local_48.tv_sec * 1000000;
    }
    lVar9 = p->clkStart;
    Abc_Print(iVar4,"%s =","Time");
    Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar7 - lVar9) / 1000000.0);
    printf("Memory:  ");
    dVar10 = Gia_ManMemory(p->pGia);
    printf("Gia = %.2f MB  ",dVar10 * 9.5367431640625e-07);
    printf("Man = %.2f MB  ",(double)p->pGia->nObjs * 24.0 * 9.5367431640625e-07);
    lVar7 = (long)(p->pMem).nPagesAlloc << 3;
    auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = 0x45300000;
    lVar9 = ((long)(p->pMem).iPage + 1) * (8L << ((byte)(p->pMem).nPageSize & 0x3f));
    auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = 0x45300000;
    printf("Cuts = %.2f MB",
           ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) +
           (auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) + 32.0) *
           9.5367431640625e-07);
    if (p->nCoarse != 0) {
      printf("   Coarse = %d (%.1f %%)",((double)p->nCoarse * 100.0) / (double)p->pGia->nObjs);
    }
    putchar(10);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Jf_ManComputeCuts( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; int i;
    if ( p->pPars->fVerbose )
    {
        printf( "Aig: CI = %d  CO = %d  AND = %d    ", Gia_ManCiNum(p->pGia), Gia_ManCoNum(p->pGia), Gia_ManAndNum(p->pGia) );
        printf( "LutSize = %d  CutMax = %d  Rounds = %d\n", p->pPars->nLutSize, p->pPars->nCutNum, p->pPars->nRounds );
        printf( "Computing cuts...\r" );
        fflush( stdout );
    }
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsBuf(pObj) )
            Jf_ObjAssignCut( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 0 );
        else if ( Gia_ObjIsAnd(pObj) )
            Jf_ObjComputeCuts( p, pObj, fEdge );
    }
    if ( p->pPars->fVerbose )
    {
        printf( "CutPair = %lu  ", (long)p->CutCount[0] );
        printf( "Merge = %lu  ",   (long)p->CutCount[1] );
        printf( "Eval = %lu  ",    (long)p->CutCount[2] );
        printf( "Cut = %lu  ",     (long)p->CutCount[3] );
        Abc_PrintTime( 1, "Time",  Abc_Clock() - p->clkStart );
        printf( "Memory:  " );
        printf( "Gia = %.2f MB  ", Gia_ManMemory(p->pGia) / (1<<20) );
        printf( "Man = %.2f MB  ", 6.0 * sizeof(int) * Gia_ManObjNum(p->pGia) / (1<<20) );
        printf( "Cuts = %.2f MB",  Vec_ReportMemory(&p->pMem) / (1<<20) );
        if ( p->nCoarse )
        printf( "   Coarse = %d (%.1f %%)",  p->nCoarse, 100.0 * p->nCoarse / Gia_ManObjNum(p->pGia) );
        printf( "\n" );
        fflush( stdout );
    }
}